

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O2

Result __thiscall Kernel::Ordering::getEqualityArgumentOrder(Ordering *this,Literal *eq)

{
  Result RVar1;
  ulong uVar2;
  
  if (s_globalOrdering._obj != this) {
    uVar2 = (ulong)(*(uint *)&(eq->super_Term).field_0xc & 0xfffffff);
    RVar1 = (*this->_vptr_Ordering[3])
                      (this,(eq->super_Term)._args[uVar2]._content,
                       (eq->super_Term)._args[uVar2 - 1]._content);
    return RVar1;
  }
  RVar1 = (uint)(eq->super_Term)._args[0]._content >> 7 & (INCOMPARABLE|EQUAL);
  if (RVar1 == 0) {
    uVar2 = (ulong)(*(uint *)&(eq->super_Term).field_0xc & 0xfffffff);
    RVar1 = (*this->_vptr_Ordering[3])
                      (this,(eq->super_Term)._args[uVar2]._content,
                       (eq->super_Term)._args[uVar2 - 1]._content);
    (eq->super_Term)._args[0]._content =
         (eq->super_Term)._args[0]._content & 0xfffffffffffffc7f |
         (ulong)((RVar1 & (INCOMPARABLE|EQUAL)) << 7);
  }
  return RVar1;
}

Assistant:

Ordering::Result Ordering::getEqualityArgumentOrder(Literal* eq) const
{
  ASS(eq->isEquality());

  if(tryGetGlobalOrdering()!=this) {
    return compare(*eq->nthArgument(0), *eq->nthArgument(1));
  }

  Result res;
  ArgumentOrderVals precomputed = static_cast<ArgumentOrderVals>(eq->getArgumentOrderValue());
  if(precomputed!=AO_UNKNOWN) {
    res = static_cast<Result>(precomputed);
    ASS_EQ(res, compare(*eq->nthArgument(0), *eq->nthArgument(1)));
  }
  else {
    res = compare(*eq->nthArgument(0), *eq->nthArgument(1));
    eq->setArgumentOrderValue(static_cast<ArgumentOrderVals>(res));
  }
  return res;
}